

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_ManFindBoolCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVolume,
                      Vec_Ptr_t *vLeaves)

{
  uint *puVar1;
  size_t __size;
  uint uVar2;
  long lVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Ivy_Obj_t *pIVar10;
  Ivy_Obj_t *pIVar11;
  ulong uVar12;
  uint uVar13;
  Ivy_Obj_t *pIVar14;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *pFanin0;
  Ivy_Obj_t *local_68;
  Ivy_Obj_t *local_60;
  ulong local_58;
  int local_4c;
  Ivy_Obj_t *local_48;
  Ivy_Obj_t *local_40;
  Ivy_Man_t *local_38;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x135,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  vFront->nSize = 0;
  vVolume->nSize = 0;
  local_38 = p;
  iVar4 = Ivy_ObjIsMuxType(pRoot);
  if (iVar4 == 0) {
    local_60 = (Ivy_Obj_t *)((ulong)pRoot->pFanin0 & 0xfffffffffffffffe);
    local_68 = (Ivy_Obj_t *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe);
    local_48 = (Ivy_Obj_t *)0x0;
  }
  else {
    local_48 = Ivy_ObjRecognizeMux(pRoot,&local_60,&local_68);
  }
  pIVar14 = local_60;
  local_60->field_0x8 = local_60->field_0x8 | 0x10;
  uVar8 = vFront->nSize;
  if (uVar8 == vFront->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,0x80);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = 0x10;
    }
    else {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar8 << 4);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar5 = vFront->pArray;
  }
  pIVar10 = local_60;
  iVar4 = vFront->nSize;
  vFront->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pIVar14;
  uVar8 = vVolume->nSize;
  if (uVar8 == vVolume->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = 0x10;
    }
    else {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar5 = vVolume->pArray;
  }
  pIVar14 = local_68;
  iVar4 = vVolume->nSize;
  vVolume->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pIVar10;
  *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x20;
  uVar8 = vFront->nSize;
  if (uVar8 == vFront->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,0x80);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = 0x10;
    }
    else {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar8 << 4);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar5 = vFront->pArray;
  }
  pIVar10 = local_68;
  iVar4 = vFront->nSize;
  vFront->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pIVar14;
  uVar8 = vVolume->nSize;
  if (uVar8 == vVolume->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = 0x10;
    }
    else {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
      }
      vVolume->pArray = ppvVar5;
      vVolume->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar5 = vVolume->pArray;
  }
  iVar4 = vVolume->nSize;
  vVolume->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pIVar10;
  uVar8 = *(uint *)&pRoot->field_0x8;
  uVar13 = uVar8 >> 0xb;
  uVar9 = (ulong)pRoot->pFanin0 & 0xfffffffffffffffe;
  uVar12 = (ulong)pRoot->pFanin1 & 0xfffffffffffffffe;
  if (*(uint *)(uVar12 + 8) >> 0xb < *(uint *)(uVar9 + 8) >> 0xb) {
    uVar12 = uVar9;
  }
  if (uVar13 != (*(uint *)(uVar12 + 8) >> 0xb) + (uint)((uVar8 & 0xf) == 6) + 1) {
    __assert_fail("Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x14a,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  local_4c = 1;
  if (0x5fff < uVar8) {
    local_4c = uVar13 - 10;
  }
  if (local_4c < (int)uVar13) {
    pIVar14 = (Ivy_Obj_t *)0x0;
    local_40 = pRoot;
    do {
      uVar12 = (ulong)uVar13;
      uVar13 = uVar13 - 1;
LAB_00929140:
      uVar8 = vFront->nSize;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        while (pIVar14 = (Ivy_Obj_t *)vFront->pArray[uVar9],
              *(uint *)&pIVar14->field_0x8 >> 0xb != uVar13) {
          uVar9 = uVar9 + 1;
          if (uVar8 == uVar9) goto LAB_009294e9;
        }
      }
      if ((uint)uVar9 != uVar8) {
        uVar2 = *(uint *)&pIVar14->field_0x8;
        if ((int)uVar12 <= (int)(uVar2 >> 0xb)) {
          __assert_fail("(int)pObj->Level <= Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                        ,0x157,
                        "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        if (((uVar2 >> 5 ^ uVar2 >> 4) & 1) == 0) {
          __assert_fail("pObj->fMarkA ^ pObj->fMarkB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                        ,0x158,
                        "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        lVar6 = (ulong)uVar8 + 1;
        do {
          if ((int)lVar6 + -1 < 1) goto LAB_00929948;
          lVar7 = lVar6 + -1;
          lVar3 = lVar6 + -2;
          lVar6 = lVar7;
        } while ((Ivy_Obj_t *)vFront->pArray[lVar3] != pIVar14);
        for (; (int)lVar7 < (int)uVar8; lVar7 = lVar7 + 1) {
          vFront->pArray[lVar7 + -1] = vFront->pArray[lVar7];
        }
        iVar4 = uVar8 - 1;
        vFront->nSize = iVar4;
        pIVar10 = (Ivy_Obj_t *)((ulong)pIVar14->pFanin0 & 0xfffffffffffffffe);
        local_60 = pIVar10;
        if ((pIVar10->field_0x8 & 0x30) == 0) {
          if (iVar4 == vFront->nCap) {
            if ((int)uVar8 < 0x11) {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,0x80);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = 0x10;
            }
            else {
              __size = (ulong)(uint)(iVar4 * 2) * 8;
              local_58 = uVar12;
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(__size);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,__size);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = iVar4 * 2;
              uVar12 = local_58;
            }
          }
          else {
            ppvVar5 = vFront->pArray;
          }
          pIVar11 = local_60;
          iVar4 = vFront->nSize;
          vFront->nSize = iVar4 + 1;
          ppvVar5[iVar4] = pIVar10;
          uVar8 = vVolume->nSize;
          if (uVar8 == vVolume->nCap) {
            if ((int)uVar8 < 0x10) {
              if (vVolume->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
              }
              vVolume->pArray = ppvVar5;
              vVolume->nCap = 0x10;
            }
            else {
              local_58 = uVar12;
              if (vVolume->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
              }
              vVolume->pArray = ppvVar5;
              vVolume->nCap = uVar8 * 2;
              uVar12 = local_58;
            }
          }
          else {
            ppvVar5 = vVolume->pArray;
          }
          iVar4 = vVolume->nSize;
          vVolume->nSize = iVar4 + 1;
          ppvVar5[iVar4] = pIVar11;
        }
        uVar8 = *(uint *)&pIVar14->field_0x8;
        if ((uVar8 & 0x10) != 0) {
          *(uint *)&local_60->field_0x8 = *(uint *)&local_60->field_0x8 | 0x10;
          uVar8 = *(uint *)&pIVar14->field_0x8;
        }
        if ((uVar8 & 0x20) != 0) {
          *(uint *)&local_60->field_0x8 = *(uint *)&local_60->field_0x8 | 0x20;
          uVar8 = *(uint *)&pIVar14->field_0x8;
        }
        pIVar10 = local_60;
        if ((uVar8 & 0xf) == 7) goto LAB_009294da;
        pIVar10 = (Ivy_Obj_t *)((ulong)pIVar14->pFanin1 & 0xfffffffffffffffe);
        local_68 = pIVar10;
        if ((pIVar10->field_0x8 & 0x30) == 0) {
          uVar8 = vFront->nSize;
          if (uVar8 == vFront->nCap) {
            if ((int)uVar8 < 0x10) {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,0x80);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = 0x10;
            }
            else {
              local_58 = uVar12;
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar8 << 4);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = uVar8 * 2;
              uVar12 = local_58;
            }
          }
          else {
            ppvVar5 = vFront->pArray;
          }
          pIVar11 = local_68;
          iVar4 = vFront->nSize;
          vFront->nSize = iVar4 + 1;
          ppvVar5[iVar4] = pIVar10;
          uVar8 = vVolume->nSize;
          if (uVar8 == vVolume->nCap) {
            if ((int)uVar8 < 0x10) {
              if (vVolume->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
              }
              vVolume->pArray = ppvVar5;
              vVolume->nCap = 0x10;
            }
            else {
              local_58 = uVar12;
              if (vVolume->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
              }
              vVolume->pArray = ppvVar5;
              vVolume->nCap = uVar8 * 2;
              uVar12 = local_58;
            }
          }
          else {
            ppvVar5 = vVolume->pArray;
          }
          iVar4 = vVolume->nSize;
          vVolume->nSize = iVar4 + 1;
          ppvVar5[iVar4] = pIVar11;
          uVar8 = *(uint *)&pIVar14->field_0x8;
        }
        if ((uVar8 & 0x10) != 0) {
          *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x10;
          uVar8 = *(uint *)&pIVar14->field_0x8;
        }
        if ((uVar8 & 0x20) != 0) {
          *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x20;
        }
        pIVar10 = local_68;
        pIVar11 = local_60;
        if ((~*(uint *)&local_60->field_0x8 & 0x30) != 0) goto LAB_009294da;
        goto LAB_009294fb;
      }
LAB_009294e9:
    } while (local_4c < (int)uVar13);
  }
  return 0;
LAB_009294da:
  pIVar11 = pIVar10;
  if ((~*(uint *)&pIVar10->field_0x8 & 0x30) != 0) goto LAB_00929140;
LAB_009294fb:
  if ((local_48 != (Ivy_Obj_t *)0x0) && ((local_48->field_0x8 & 0x30) == 0)) {
    uVar8 = vFront->nSize;
    if (uVar8 == vFront->nCap) {
      if ((int)uVar8 < 0x10) {
        if (vFront->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vFront->pArray,0x80);
        }
        vFront->pArray = ppvVar5;
        vFront->nCap = 0x10;
      }
      else {
        if (vFront->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar8 << 4);
        }
        vFront->pArray = ppvVar5;
        vFront->nCap = uVar8 * 2;
      }
    }
    else {
      ppvVar5 = vFront->pArray;
    }
    iVar4 = vFront->nSize;
    vFront->nSize = iVar4 + 1;
    ppvVar5[iVar4] = local_48;
  }
  if (0 < vVolume->nSize) {
    lVar6 = 0;
    do {
      pIVar14 = (Ivy_Obj_t *)vVolume->pArray[lVar6];
      *(uint *)&pIVar14->field_0x8 = *(uint *)&pIVar14->field_0x8 & 0xffffffcf;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vVolume->nSize);
  }
  if (0 < vFront->nSize) {
    lVar6 = 0;
    do {
      pIVar14 = (Ivy_Obj_t *)vFront->pArray[lVar6];
      *(uint *)&pIVar14->field_0x8 = *(uint *)&pIVar14->field_0x8 | 0x10;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vFront->nSize);
  }
  vLeaves->nSize = 0;
  vVolume->nSize = 0;
  iVar4 = Ivy_ManFindBoolCut_rec(local_38,local_40,vLeaves,vVolume,pIVar11);
  if (iVar4 == 0) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x19f,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (0 < vFront->nSize) {
    lVar6 = 0;
    do {
      pIVar14 = (Ivy_Obj_t *)vFront->pArray[lVar6];
      *(uint *)&pIVar14->field_0x8 = *(uint *)&pIVar14->field_0x8 & 0xffffffef;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vFront->nSize);
  }
  if (0 < vVolume->nSize) {
    lVar6 = 0;
    do {
      pIVar14 = (Ivy_Obj_t *)vVolume->pArray[lVar6];
      *(uint *)&pIVar14->field_0x8 = *(uint *)&pIVar14->field_0x8 | 0x10;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vVolume->nSize);
  }
  uVar8 = vLeaves->nSize;
  do {
    lVar6 = 0;
    if (0 < (int)uVar8) {
      lVar6 = 0;
      do {
        pIVar14 = (Ivy_Obj_t *)vLeaves->pArray[lVar6];
        uVar13 = Ivy_ManFindBoolCutCost(pIVar14);
        uVar8 = vLeaves->nSize;
        if (uVar13 < 2) break;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar8);
    }
    if ((uint)lVar6 == uVar8) {
      if (vVolume->nSize < 1) {
        return 1;
      }
      lVar6 = 0;
      do {
        puVar1 = (uint *)((long)vVolume->pArray[lVar6] + 8);
        *puVar1 = *puVar1 & 0xffffffef;
        lVar6 = lVar6 + 1;
      } while (lVar6 < vVolume->nSize);
      return 1;
    }
    lVar6 = (ulong)uVar8 + 1;
    do {
      if ((int)lVar6 + -1 < 1) {
LAB_00929948:
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      lVar7 = lVar6 + -1;
      lVar3 = lVar6 + -2;
      lVar6 = lVar7;
    } while ((Ivy_Obj_t *)vLeaves->pArray[lVar3] != pIVar14);
    for (; (int)lVar7 < (int)uVar8; lVar7 = lVar7 + 1) {
      vLeaves->pArray[lVar7 + -1] = vLeaves->pArray[lVar7];
    }
    uVar8 = uVar8 - 1;
    vLeaves->nSize = uVar8;
    pIVar10 = (Ivy_Obj_t *)((ulong)pIVar14->pFanin0 & 0xfffffffffffffffe);
    local_60 = pIVar10;
    if ((*(uint *)&pIVar10->field_0x8 & 0x10) == 0) {
      *(uint *)&pIVar10->field_0x8 = *(uint *)&pIVar10->field_0x8 | 0x10;
      uVar8 = vVolume->nSize;
      if (uVar8 == vVolume->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vVolume->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
          }
          vVolume->pArray = ppvVar5;
          vVolume->nCap = 0x10;
        }
        else {
          if (vVolume->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
          }
          vVolume->pArray = ppvVar5;
          vVolume->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar5 = vVolume->pArray;
      }
      pIVar11 = local_60;
      iVar4 = vVolume->nSize;
      vVolume->nSize = iVar4 + 1;
      ppvVar5[iVar4] = pIVar10;
      uVar8 = vLeaves->nSize;
      if (uVar8 == vLeaves->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vLeaves->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vLeaves->pArray,0x80);
          }
          vLeaves->pArray = ppvVar5;
          vLeaves->nCap = 0x10;
        }
        else {
          if (vLeaves->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vLeaves->pArray,(ulong)uVar8 << 4);
          }
          vLeaves->pArray = ppvVar5;
          vLeaves->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar5 = vLeaves->pArray;
      }
      iVar4 = vLeaves->nSize;
      uVar8 = iVar4 + 1;
      vLeaves->nSize = uVar8;
      ppvVar5[iVar4] = pIVar11;
    }
    if ((*(uint *)&pIVar14->field_0x8 & 0xf) != 7) {
      pIVar10 = (Ivy_Obj_t *)((ulong)pIVar14->pFanin1 & 0xfffffffffffffffe);
      local_68 = pIVar10;
      if ((*(uint *)&pIVar10->field_0x8 & 0x10) == 0) {
        *(uint *)&pIVar10->field_0x8 = *(uint *)&pIVar10->field_0x8 | 0x10;
        uVar8 = vVolume->nSize;
        if (uVar8 == vVolume->nCap) {
          if ((int)uVar8 < 0x10) {
            if (vVolume->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
            }
            vVolume->pArray = ppvVar5;
            vVolume->nCap = 0x10;
          }
          else {
            if (vVolume->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar8 << 4);
            }
            vVolume->pArray = ppvVar5;
            vVolume->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar5 = vVolume->pArray;
        }
        pIVar11 = local_68;
        iVar4 = vVolume->nSize;
        vVolume->nSize = iVar4 + 1;
        ppvVar5[iVar4] = pIVar10;
        uVar8 = vLeaves->nSize;
        if (uVar8 == vLeaves->nCap) {
          if ((int)uVar8 < 0x10) {
            if (vLeaves->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vLeaves->pArray,0x80);
            }
            vLeaves->pArray = ppvVar5;
            vLeaves->nCap = 0x10;
          }
          else {
            if (vLeaves->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vLeaves->pArray,(ulong)uVar8 << 4);
            }
            vLeaves->pArray = ppvVar5;
            vLeaves->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar5 = vLeaves->pArray;
        }
        iVar4 = vLeaves->nSize;
        uVar8 = iVar4 + 1;
        vLeaves->nSize = uVar8;
        ppvVar5[iVar4] = pIVar11;
      }
    }
  } while( true );
}

Assistant:

int Ivy_ManFindBoolCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVolume, Vec_Ptr_t * vLeaves )
{
    Ivy_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pFaninC, * pFanin0, * pFanin1, * pPivot;
    int RetValue, LevelLimit, Lev, k;
    assert( !Ivy_IsComplement(pRoot) );
    // clear the frontier and collect the nodes
    Vec_PtrClear( vFront );
    Vec_PtrClear( vVolume );
    if ( Ivy_ObjIsMuxType(pRoot) )
        pFaninC = Ivy_ObjRecognizeMux( pRoot, &pFanin0, &pFanin1 );
    else
    {
        pFaninC = NULL;
        pFanin0 = Ivy_ObjFanin0(pRoot);
        pFanin1 = Ivy_ObjFanin1(pRoot); 
    }
    // start cone A
    pFanin0->fMarkA = 1;
    Vec_PtrPush( vFront, pFanin0 );
    Vec_PtrPush( vVolume, pFanin0 );
    // start cone B
    pFanin1->fMarkB = 1;
    Vec_PtrPush( vFront, pFanin1 );
    Vec_PtrPush( vVolume, pFanin1 );
    // iteratively expand until the common node (pPivot) is found or limit is reached
    assert( Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot) );
    pPivot = NULL;
    LevelLimit = IVY_MAX( Ivy_ObjLevel(pRoot) - 10, 1 );
    for ( Lev = Ivy_ObjLevel(pRoot) - 1; Lev >= LevelLimit; Lev-- )
    {
        while ( 1 )
        {
            // find the next node to expand on this level
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
                if ( (int)pObj->Level == Lev )
                    break;
            if ( k == Vec_PtrSize(vFront) )
                break;
            assert( (int)pObj->Level <= Lev );
            assert( pObj->fMarkA ^ pObj->fMarkB );
            // remove the old node
            Vec_PtrRemove( vFront, pObj );

            // expand this node
            pFanin0 = Ivy_ObjFanin0(pObj);
            if ( !pFanin0->fMarkA && !pFanin0->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin0 );
                Vec_PtrPush( vVolume, pFanin0 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin0->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin0->fMarkB = 1; 

            if ( Ivy_ObjIsBuf(pObj) )
            {
                if ( pFanin0->fMarkA && pFanin0->fMarkB )
                {
                    pPivot = pFanin0;
                    break;
                }
                continue;
            }

            // expand this node
            pFanin1 = Ivy_ObjFanin1(pObj); 
            if ( !pFanin1->fMarkA && !pFanin1->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin1 );
                Vec_PtrPush( vVolume, pFanin1 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin1->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin1->fMarkB = 1; 

            // consider if it is time to quit
            if ( pFanin0->fMarkA && pFanin0->fMarkB )
            {
                pPivot = pFanin0;
                break;
            }
            if ( pFanin1->fMarkA && pFanin1->fMarkB )
            {
                pPivot = pFanin1;
                break;
            }
        }
        if ( pPivot != NULL )
            break;
    }
    if ( pPivot == NULL )
        return 0;
    // if the MUX control is defined, it should not be
    if ( pFaninC && !pFaninC->fMarkA && !pFaninC->fMarkB )
        Vec_PtrPush( vFront, pFaninC );
    // clean the markings
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = pObj->fMarkB = 0;

    // mark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 1;
    // cut exists, collect all the nodes on the shortest path to the pivot
    Vec_PtrClear( vLeaves );
    Vec_PtrClear( vVolume );
    RetValue = Ivy_ManFindBoolCut_rec( p, pRoot, vLeaves, vVolume, pPivot );
    assert( RetValue == 1 );
    // unmark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 0;

    // mark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 1;
    // expand the cut without increasing its size
    while ( 1 )
    {
        Vec_PtrForEachEntry( Ivy_Obj_t *, vLeaves, pObj, k )
            if ( Ivy_ManFindBoolCutCost(pObj) < 2 )
                break;
        if ( k == Vec_PtrSize(vLeaves) )
            break;
        // the node can be expanded
        // remove the old node
        Vec_PtrRemove( vLeaves, pObj );
        // expand this node
        pFanin0 = Ivy_ObjFanin0(pObj);
        if ( !pFanin0->fMarkA )
        {
            pFanin0->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin0 );
            Vec_PtrPush( vLeaves, pFanin0 );
        }
        if ( Ivy_ObjIsBuf(pObj) )
            continue;
        // expand this node
        pFanin1 = Ivy_ObjFanin1(pObj);
        if ( !pFanin1->fMarkA )
        {
            pFanin1->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin1 );
            Vec_PtrPush( vLeaves, pFanin1 );
        }        
    }
    // unmark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 0;
    return 1;
}